

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O1

void UConverter_fromUnicode_CompoundText_OFFSETS(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  UBool useFallback;
  char cVar1;
  UChar UVar2;
  UConverter *pUVar3;
  bool bVar4;
  ushort uVar5;
  int32_t iVar6;
  uint uVar7;
  uint8_t uVar8;
  uint uVar9;
  uint8_t *puVar10;
  ulong uVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint uVar14;
  int iVar15;
  UChar *pUVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint c;
  uint32_t pValue;
  uint8_t tmpTargetBuffer [7];
  uint local_84;
  uint8_t local_7f [7];
  uint8_t *local_78;
  ulong local_70;
  uint8_t *local_68;
  UChar *local_60;
  UConverter *local_58;
  void *local_50;
  UErrorCode *local_48;
  UConverterFromUnicodeArgs *local_40;
  UChar *local_38;
  
  local_58 = args->converter;
  pUVar16 = args->source;
  local_68 = (uint8_t *)args->target;
  puVar13 = (uint8_t *)args->targetLimit;
  local_38 = args->sourceLimit;
  useFallback = local_58->useFallback;
  local_50 = local_58->extraInfo;
  local_70 = (ulong)*(uint *)((long)local_58->extraInfo + 0xa0);
  uVar19 = local_58->fromUChar32;
  local_40 = args;
  local_48 = err;
  local_78 = puVar13;
  if (uVar19 != 0 && local_68 < puVar13) goto LAB_002b6637;
  do {
    if (local_38 <= pUVar16) {
LAB_002b69b7:
      *(int *)((long)local_50 + 0xa0) = (int)local_70;
      args->source = pUVar16;
      args->target = (char *)local_68;
      return;
    }
    if (puVar13 <= local_68) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002b69b7;
    }
    UVar2 = *pUVar16;
    uVar19 = (uint)(ushort)UVar2;
    pUVar16 = pUVar16 + 1;
    puVar13 = local_68;
    c = uVar19;
    if ((uVar19 & 0xf800) == 0xd800) {
      if (((ushort)UVar2 >> 10 & 1) == 0) {
LAB_002b6637:
        if (pUVar16 < local_38) {
          UVar2 = *pUVar16;
          uVar5 = UVar2 & 0xfc00;
          if (uVar5 == 0xdc00) {
            pUVar16 = pUVar16 + 1;
            iVar20 = uVar19 * 0x400;
            uVar19 = 0;
            c = (uint)(ushort)UVar2 + iVar20 + 0xfca02400;
          }
          else {
            *err = U_ILLEGAL_CHAR_FOUND;
            c = uVar19;
          }
          local_58->fromUChar32 = uVar19;
          puVar13 = local_68;
          if (uVar5 == 0xdc00) goto LAB_002b668d;
          goto LAB_002b69b7;
        }
      }
      else {
        *err = U_ILLEGAL_CHAR_FOUND;
      }
      local_58->fromUChar32 = uVar19;
      goto LAB_002b69b7;
    }
LAB_002b668d:
    if (c < 0xb) {
      uVar19 = 0;
      bVar4 = false;
      if ((0x601U >> (c & 0x1f) & 1) == 0) goto LAB_002b67d2;
    }
    else {
LAB_002b67d2:
      uVar19 = 0;
      bVar4 = false;
      if (0x5f < (c & 0xffffff60) - 0x20) {
        uVar19 = 0x10;
        if ((0xf < c - 0x102) || (bVar4 = false, (0xfc3fU >> (c - 0x102 & 0x1f) & 1) == 0)) {
          uVar9 = c & 0xfffffffc;
          bVar4 = false;
          if (((uVar9 != 0x118) && (bVar4 = false, 1 < (c & 0xfffffffb) - 0x139)) &&
             ((0x14 < c - 0x141 || (bVar4 = false, (0x19804fU >> (c - 0x141 & 0x1f) & 1) == 0)))) {
            uVar14 = c & 0xfffffffe;
            uVar7 = 0x10;
            if (uVar14 != 0x15e && uVar9 != 0x158) {
              bVar4 = false;
              if ((0x1e < c - 0x160) || ((0x7e03c03fU >> (c - 0x160 & 0x1f) & 1) == 0)) {
                if ((c - 0x2c7 < 0x17) && ((0x560001U >> (c - 0x2c7 & 0x1f) & 1) != 0))
                goto LAB_002b66ad;
                uVar7 = 0x11;
                uVar19 = 0x11;
                if ((uVar9 != 0x108) &&
                   (((5 < c - 0x11c || ((0x33U >> (c - 0x11c & 0x1f) & 1) == 0)) && (uVar9 != 0x124)
                    ))) {
                  if ((c - 0x134 < 0x3a) &&
                     (bVar4 = false, (0x300030000000003U >> ((ulong)(c - 0x134) & 0x3f) & 1) != 0))
                  goto LAB_002b66ad;
                  uVar19 = 0x12;
                  uVar7 = 0x12;
                  if (uVar9 != 0x174) {
                    bVar4 = false;
                    if ((int)c < 0x1e56) {
                      if ((c - 0x1e0a < 0x38) &&
                         ((0xc0000000300003U >> ((ulong)(c - 0x1e0a) & 0x3f) & 1) != 0))
                      goto LAB_002b66ad;
                      if ((0x26 < c - 0x152) ||
                         ((0x4000000003U >> ((ulong)(c - 0x152) & 0x3f) & 1) == 0))
                      goto LAB_002b6b26;
LAB_002b6b1a:
                      uVar7 = 0x13;
                    }
                    else if ((0x2f < c - 0x1e56) ||
                            ((0xfc0000300c03U >> ((ulong)(c - 0x1e56) & 0x3f) & 1) == 0)) {
                      if (1 < c - 0x1ef2) {
                        if (c == 0x20ac) goto LAB_002b6b1a;
LAB_002b6b26:
                        bVar4 = false;
                        uVar19 = 0xf;
                        if (0x1c < c - 0xe3f && 0x39 < c - 0xe01) {
                          uVar19 = 0xe;
                          uVar7 = 0xe;
                          if (((c - 0x100 < 0x24) &&
                              ((0xc00cc0003U >> ((ulong)(c - 0x100) & 0x3f) & 1) != 0)) ||
                             (uVar14 == 0x12e || uVar9 == 0x128)) goto LAB_002b689a;
                          if ((0x3d < c - 0x136) ||
                             (bVar4 = false,
                             (0x303f000300f18067U >> ((ulong)(c - 0x136) & 0x3f) & 1) == 0)) {
                            uVar19 = 2;
                            uVar7 = 2;
                            if (uVar14 == 700) goto LAB_002b689a;
                            bVar4 = false;
                            if (c != 0x2015 && 0x4a < c - 900) {
                              uVar7 = 3;
                              uVar19 = 3;
                              if ((((c - 0x60c < 0x14) &&
                                   ((0x88001U >> (c - 0x60c & 0x1f) & 1) != 0)) ||
                                  ((c - 0x640 < 0x13 || c - 0x621 < 0x1a ||
                                   (c == 0x200b || c - 0x660 < 0xe)))) ||
                                 ((c - 0xfe70 < 5 && (c - 0xfe70 != 3)))) goto LAB_002b689a;
                              bVar4 = false;
                              if (0x48 < c - 0xfe76) {
                                uVar19 = 0xd;
                                uVar7 = 0xd;
                                if ((c - 0x5d0 < 0x1b) || (bVar4 = false, c == 0x2017))
                                goto LAB_002b689a;
                                if (c != 0x203e) {
                                  bVar4 = false;
                                  uVar19 = 0xc;
                                  if (c != 0x2116 && 0x5e < c - 0x401) {
                                    if ((0x13 < c - 0x11e) ||
                                       ((0xc0003U >> (c - 0x11e & 0x1f) & 1) == 0)) {
                                      uVar19 = 0xffffffff;
                                      bVar4 = true;
                                      if (uVar9 != 0x218) goto LAB_002b66ad;
                                    }
                                    uVar19 = 1;
                                    bVar4 = false;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      goto LAB_002b66ad;
                    }
                  }
                }
              }
            }
LAB_002b689a:
            uVar19 = uVar7;
            bVar4 = false;
          }
        }
      }
    }
LAB_002b66ad:
    uVar18 = 0;
    if ((!bVar4) && ((uint)local_70 != uVar19)) {
      uVar8 = escSeqCompoundText[(int)uVar19][0];
      uVar18 = 0;
      do {
        local_7f[uVar18] = uVar8;
        uVar8 = *(uint8_t *)((long)(int)uVar19 * 5 + 0x35ddf1 + uVar18);
        uVar18 = uVar18 + 1;
      } while (uVar8 != '\0');
      local_70 = (ulong)uVar19;
    }
    local_68 = puVar13;
    if (uVar19 == 0) {
      uVar11 = uVar18 & 0xffffffff;
      uVar18 = (ulong)((int)uVar18 + 1);
      local_7f[uVar11] = (uint8_t)c;
      puVar13 = local_78;
    }
    else {
      if (uVar19 == 0xffffffff) {
        puVar12 = escSeqCompoundText[1] + 1;
        lVar17 = 0;
        local_60 = pUVar16;
LAB_002b6712:
        iVar6 = ucnv_MBCSFromUChar32_63
                          (*(UConverterSharedData **)((long)local_50 + lVar17 * 8 + 8),c,&local_84,
                           useFallback);
        pUVar16 = local_60;
        puVar13 = local_78;
        if (iVar6 < 1) break;
        if ((int)local_70 + -1 != (int)lVar17) {
          uVar8 = (*(uint8_t (*) [5])(puVar12 + -1))[0];
          puVar10 = local_7f + (uVar18 & 0xffffffff);
          do {
            *puVar10 = uVar8;
            uVar8 = *puVar12;
            puVar10 = puVar10 + 1;
            uVar18 = (ulong)((int)uVar18 + 1);
            puVar12 = puVar12 + 1;
          } while (uVar8 != '\0');
          local_70 = lVar17 + 1;
        }
        args = local_40;
        err = local_48;
        puVar12 = local_7f + (int)uVar18;
        iVar15 = iVar6 + 1;
        iVar20 = iVar6 * 8;
        do {
          iVar20 = iVar20 + -8;
          *puVar12 = (uint8_t)(local_84 >> ((byte)iVar20 & 0x1f));
          puVar12 = puVar12 + 1;
          uVar18 = (ulong)((int)uVar18 + 1);
          iVar15 = iVar15 + -1;
        } while (1 < iVar15);
        goto LAB_002b692e;
      }
      iVar6 = ucnv_MBCSFromUChar32_63
                        (*(UConverterSharedData **)((long)local_50 + (long)(int)(uint)local_70 * 8),
                         c,&local_84,useFallback);
      puVar13 = local_78;
      if (0 < iVar6) {
        puVar12 = local_7f + (uVar18 & 0xffffffff);
        iVar20 = iVar6 + 1;
        iVar15 = iVar6 * 8;
        uVar18 = (ulong)(uint)((int)uVar18 + iVar6);
        do {
          iVar15 = iVar15 + -8;
          *puVar12 = (uint8_t)(local_84 >> ((byte)iVar15 & 0x1f));
          puVar12 = puVar12 + 1;
          iVar20 = iVar20 + -1;
        } while (1 < iVar20);
      }
    }
LAB_002b692e:
    uVar11 = 0;
    if (0 < (int)uVar18) {
      uVar11 = 0;
      do {
        puVar12 = local_68 + uVar11;
        if (puVar13 <= puVar12) {
          *err = U_BUFFER_OVERFLOW_ERROR;
          local_68 = puVar12;
          goto LAB_002b6963;
        }
        *puVar12 = local_7f[uVar11];
        uVar11 = uVar11 + 1;
      } while ((uVar18 & 0xffffffff) != uVar11);
      local_68 = local_68 + uVar11;
    }
LAB_002b6963:
    if ((*err == U_BUFFER_OVERFLOW_ERROR) && ((int)uVar11 < (int)uVar18)) {
      uVar11 = uVar11 & 0xffffffff;
      do {
        uVar8 = local_7f[uVar11];
        pUVar3 = args->converter;
        cVar1 = pUVar3->charErrorBufferLength;
        pUVar3->charErrorBufferLength = cVar1 + '\x01';
        pUVar3->charErrorBuffer[cVar1] = uVar8;
        uVar11 = uVar11 + 1;
      } while ((uVar18 & 0xffffffff) != uVar11);
    }
  } while( true );
  puVar12 = puVar12 + 5;
  lVar17 = lVar17 + 1;
  args = local_40;
  err = local_48;
  if (lVar17 == 0xb) goto LAB_002b692e;
  goto LAB_002b6712;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_CompoundText_OFFSETS(UConverterFromUnicodeArgs* args, UErrorCode* err){
    UConverter *cnv = args->converter;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    /* int32_t* offsets = args->offsets; */
    UChar32 sourceChar;
    UBool useFallback = cnv->useFallback;
    uint8_t tmpTargetBuffer[7];
    int32_t tmpTargetBufferLength = 0;
    COMPOUND_TEXT_CONVERTERS currentState, tmpState;
    uint32_t pValue;
    int32_t pValueLength = 0;
    int32_t i, n, j;

    UConverterDataCompoundText *myConverterData = (UConverterDataCompoundText *) cnv->extraInfo;

    currentState = myConverterData->state;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while( source < sourceLimit){
        if(target < targetLimit){

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
             if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

             tmpTargetBufferLength = 0;
             tmpState = getState(sourceChar);

             if (tmpState != DO_SEARCH && currentState != tmpState) {
                 /* Get escape sequence if necessary */
                 currentState = tmpState;
                 for (i = 0; escSeqCompoundText[currentState][i] != 0; i++) {
                     tmpTargetBuffer[tmpTargetBufferLength++] = escSeqCompoundText[currentState][i];
                 }
             }

             if (tmpState == DO_SEARCH) {
                 /* Test all available converters */
                 for (i = 1; i < SEARCH_LENGTH; i++) {
                     pValueLength = ucnv_MBCSFromUChar32(myConverterData->myConverterArray[i], sourceChar, &pValue, useFallback);
                     if (pValueLength > 0) {
                         tmpState = (COMPOUND_TEXT_CONVERTERS)i;
                         if (currentState != tmpState) {
                             currentState = tmpState;
                             for (j = 0; escSeqCompoundText[currentState][j] != 0; j++) {
                                 tmpTargetBuffer[tmpTargetBufferLength++] = escSeqCompoundText[currentState][j];
                             }
                         }
                         for (n = (pValueLength - 1); n >= 0; n--) {
                             tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)(pValue >> (n * 8));
                         }
                         break;
                     }
                 }
             } else if (tmpState == COMPOUND_TEXT_SINGLE_0) {
                 tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)sourceChar;
             } else {
                 pValueLength = ucnv_MBCSFromUChar32(myConverterData->myConverterArray[currentState], sourceChar, &pValue, useFallback);
                 if (pValueLength > 0) {
                     for (n = (pValueLength - 1); n >= 0; n--) {
                         tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)(pValue >> (n * 8));
                     }
                 }
             }

             for (i = 0; i < tmpTargetBufferLength; i++) {
                 if (target < targetLimit) {
                     *target++ = tmpTargetBuffer[i];
                 } else {
                     *err = U_BUFFER_OVERFLOW_ERROR;
                     break;
                 }
             }

             if (*err == U_BUFFER_OVERFLOW_ERROR) {
                 for (; i < tmpTargetBufferLength; i++) {
                     args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = tmpTargetBuffer[i];
                 }
             }
        } else {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*save the state and return */
    myConverterData->state = currentState;
    args->source = source;
    args->target = (char*)target;
}